

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_open_memory.c
# Opt level: O2

int read_open_memory_internal(archive *a,void *buff,size_t size,size_t read_size,int level)

{
  int iVar1;
  undefined8 *client_data;
  void *__s;
  size_t __size;
  
  client_data = (undefined8 *)calloc(1,0x38);
  if (client_data != (undefined8 *)0x0) {
    client_data[1] = buff;
    *client_data = buff;
    client_data[2] = size + (long)buff;
    client_data[3] = read_size;
    client_data[5] = 0x20;
    __size = read_size + 0x40;
    client_data[4] = __size;
    __s = malloc(__size);
    client_data[6] = __s;
    memset(__s,0xa5,__size);
    if (level != 1) {
      if (level != 2) {
        archive_read_set_seek_callback(a,memory_read_seek);
      }
      archive_read_set_open_callback(a,memory_read_open);
      archive_read_set_skip_callback(a,memory_read_skip);
    }
    archive_read_set_read_callback(a,memory_read);
    archive_read_set_close_callback(a,memory_read_close);
    archive_read_set_callback_data(a,client_data);
    iVar1 = archive_read_open1(a);
    return iVar1;
  }
  archive_set_error(a,0xc,"No memory");
  return -0x1e;
}

Assistant:

static int
read_open_memory_internal(struct archive *a, void *buff,
    size_t size, size_t read_size, int level)
{
	struct read_memory_data *mine;

	mine = (struct read_memory_data *)malloc(sizeof(*mine));
	if (mine == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	memset(mine, 0, sizeof(*mine));
	mine->start = mine->p = (unsigned char *)buff;
	mine->end = mine->start + size;
	mine->read_size = read_size;
	mine->copy_buff_offset = 32;
	mine->copy_buff_size = read_size + mine->copy_buff_offset * 2;
	mine->copy_buff = malloc(mine->copy_buff_size);
	memset(mine->copy_buff, 0xA5, mine->copy_buff_size);

	switch (level) {
	case 3:
		archive_read_set_seek_callback(a, memory_read_seek);
	case 2:
		archive_read_set_open_callback(a, memory_read_open);
		archive_read_set_skip_callback(a, memory_read_skip);
	case 1:
		archive_read_set_read_callback(a, memory_read);
		archive_read_set_close_callback(a, memory_read_close);
		archive_read_set_callback_data(a, mine);
	}
	return archive_read_open1(a);
}